

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParams(ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
               unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters *pZVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  ZSTD_compressionParameters cPar;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ZSTD_compressionParameters cp;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  uVar8 = dictSize + 500 + srcSizeHint;
  if (srcSizeHint != 0) {
    uVar8 = dictSize + srcSizeHint;
  }
  uVar8 = -(ulong)(dictSize + srcSizeHint == 0) | uVar8;
  lVar10 = (ulong)(uVar8 < 0x20001) + (ulong)(uVar8 < 0x40001) + (ulong)(uVar8 < 0x4001);
  iVar7 = 3;
  if (compressionLevel != 0) {
    iVar7 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar7 = 0;
  }
  iVar9 = 0x16;
  if (compressionLevel < 0x17) {
    iVar9 = iVar7;
  }
  pZVar1 = ZSTD_defaultCParameters[lVar10] + iVar9;
  uVar3 = pZVar1->searchLog;
  uVar4 = pZVar1->windowLog;
  uVar5 = pZVar1->chainLog;
  uVar6 = pZVar1->hashLog;
  cPar.hashLog = uVar6;
  cPar.chainLog = uVar5;
  cPar.windowLog = uVar4;
  puVar2 = (undefined8 *)(lVar10 * 0x284 + 0x564ecc + (long)iVar9 * 0x1c);
  uStack_14 = puVar2[1];
  uStack_18 = (undefined4)((ulong)*puVar2 >> 0x20);
  if (compressionLevel < 0) {
    uStack_14._4_4_ = (undefined4)((ulong)uStack_14 >> 0x20);
    uStack_14 = CONCAT44(uStack_14._4_4_,-compressionLevel);
  }
  cPar.searchLog = uVar3;
  cPar.minMatch = uStack_18;
  cPar.targetLength = (undefined4)uStack_14;
  cPar.strategy = uStack_14._4_4_;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    size_t const addedSize = srcSizeHint ? 0 : 500;
    U64 const rSize = srcSizeHint+dictSize ? srcSizeHint+dictSize+addedSize : (U64)-1;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);   /* intentional underflow for srcSizeHint == 0 */
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}